

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

base_block_t *
base_block_alloc(tsdn_t *tsdn,base_t *base,ehooks_t *ehooks,uint ind,pszind_t *pind_last,
                size_t *duckdb_je_extent_sn_next,size_t size,size_t alignment)

{
  uint uVar1;
  extent_hooks_t *peVar2;
  uint64_t uVar3;
  long lVar4;
  base_t *pbVar5;
  byte bVar6;
  ulong uVar7;
  base_block_t *addr_00;
  uint uVar8;
  undefined4 in_register_0000000c;
  base_block_t *pbVar9;
  base_block_t *addr_01;
  int iVar10;
  ulong uVar11;
  void *addr;
  long lVar12;
  base_t *pbVar13;
  bool bVar14;
  _Bool commit;
  _Bool zero;
  base_t *local_40;
  uint64_t *local_38;
  
  uVar7 = size + 0xf & 0xfffffffffffffff0;
  uVar7 = (uVar7 + 0x8f & -uVar7) + ((long)duckdb_je_extent_sn_next + (uVar7 - 1) & -uVar7);
  lVar12 = -1;
  if (uVar7 < 0x7000000000000001) {
    uVar11 = uVar7 * 2 - 1;
    lVar4 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    uVar11 = 0xfff;
    if (0xe < (uint)lVar4) {
      uVar11 = ~(-1L << ((char)lVar4 - 3U & 0x3f));
    }
    uVar7 = (~uVar11 & uVar7 + uVar11) + 0x1fffff;
  }
  else {
    uVar7 = 0x7000000000200fff;
  }
  uVar1 = *(uint *)CONCAT44(in_register_0000000c,ind);
  uVar8 = uVar1 + 1;
  if (uVar8 < 0xc6) {
    uVar1 = uVar8;
  }
  uVar11 = duckdb_je_sz_pind2sz_tab[uVar1] + 0x1fffff;
  if (duckdb_je_sz_pind2sz_tab[uVar1] + 0x1fffff < uVar7) {
    uVar11 = uVar7;
  }
  uVar11 = uVar11 & 0xffffffffffe00000;
  zero = true;
  commit = true;
  local_40 = base;
  local_38 = (uint64_t *)pind_last;
  if ((extent_hooks_t *)(ehooks->ptr).repr == &duckdb_je_ehooks_default_extent_hooks) {
    addr_00 = (base_block_t *)duckdb_je_extent_alloc_mmap((void *)0x0,uVar11,0x200000,&zero,&commit)
    ;
  }
  else {
    peVar2 = (extent_hooks_t *)(ehooks->ptr).repr;
    if (peVar2 == &duckdb_je_ehooks_default_extent_hooks) {
      addr_00 = (base_block_t *)
                duckdb_je_ehooks_default_alloc_impl
                          (tsdn,(void *)0x0,uVar11,0x200000,&zero,&commit,ehooks->ind);
    }
    else {
      ehooks_pre_reentrancy(tsdn);
      addr_00 = (base_block_t *)
                (*peVar2->alloc)(peVar2,(void *)0x0,uVar11,0x200000,&zero,&commit,ehooks->ind);
      ehooks_post_reentrancy(tsdn);
    }
  }
  pbVar13 = local_40;
  if (addr_00 != (base_block_t *)0x0) {
    if ((duckdb_je_opt_metadata_thp != metadata_thp_disabled) &&
       (duckdb_je_init_system_thp_mode == thp_mode_default)) {
      if (duckdb_je_opt_metadata_thp == metadata_thp_always) {
        duckdb_je_pages_huge(addr_00,uVar11);
      }
      else if (local_40 != (base_t *)0x0 && duckdb_je_opt_metadata_thp == metadata_thp_auto) {
        malloc_mutex_lock(tsdn,&local_40->mtx);
        pbVar5 = local_40;
        bVar6 = pbVar13->auto_thp_switched;
        if ((_Bool)bVar6 == false) {
          addr_01 = pbVar13->blocks;
          pbVar9 = addr_01;
          do {
            pbVar9 = pbVar9->next;
            lVar12 = lVar12 + 1;
          } while (pbVar9 != (base_block_t *)0x0);
          if ((pbVar13->ehooks).ind == 0) {
            bVar14 = lVar12 == 3;
          }
          else {
            bVar14 = lVar12 == 0;
          }
          pbVar13 = pbVar5;
          if (bVar14) {
            local_40->auto_thp_switched = true;
            for (; addr_01 != (base_block_t *)0x0; addr_01 = addr_01->next) {
              duckdb_je_pages_huge(addr_01,addr_01->size);
              pbVar5->n_thp =
                   pbVar5->n_thp +
                   ((addr_01->size - (addr_01->edata).field_2.e_size_esn) + 0x1fffff >> 0x15);
            }
            bVar6 = pbVar5->auto_thp_switched;
          }
        }
        if ((bVar6 & 1) != 0) {
          duckdb_je_pages_huge(addr_00,uVar11);
        }
        (pbVar13->mtx).field_0.field_0.locked.repr = false;
        pthread_mutex_unlock((pthread_mutex_t *)((long)&(pbVar13->mtx).field_0 + 0x48));
      }
    }
    if (uVar11 < 0x7000000000000001) {
      uVar7 = uVar11 - 1;
      lVar12 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      uVar8 = (uint)lVar12 ^ 0x3f;
      iVar10 = 0x32 - uVar8;
      if (0x32 < uVar8) {
        iVar10 = 0;
      }
      uVar8 = ((uint)(uVar7 >> ((char)iVar10 + 0xbU & 0x3f)) & 3) + iVar10 * 4;
    }
    else {
      uVar8 = 199;
    }
    *(uint *)CONCAT44(in_register_0000000c,ind) = uVar8;
    addr_00->size = uVar11;
    addr_00->next = (base_block_t *)0x0;
    uVar3 = *local_38;
    *local_38 = uVar3 + 1;
    (addr_00->edata).e_addr = addr_00 + 1;
    (addr_00->edata).field_2.e_size_esn = uVar11 - 0x90;
    (addr_00->edata).e_sn = uVar3;
    (addr_00->edata).e_bits = (addr_00->edata).e_bits & 0xfffffffff0000000 | 0xe80afff;
  }
  return addr_00;
}

Assistant:

static base_block_t *
base_block_alloc(tsdn_t *tsdn, base_t *base, ehooks_t *ehooks, unsigned ind,
    pszind_t *pind_last, size_t *extent_sn_next, size_t size,
    size_t alignment) {
	alignment = ALIGNMENT_CEILING(alignment, QUANTUM);
	size_t usize = ALIGNMENT_CEILING(size, alignment);
	size_t header_size = sizeof(base_block_t);
	size_t gap_size = ALIGNMENT_CEILING(header_size, alignment) -
	    header_size;
	/*
	 * Create increasingly larger blocks in order to limit the total number
	 * of disjoint virtual memory ranges.  Choose the next size in the page
	 * size class series (skipping size classes that are not a multiple of
	 * HUGEPAGE), or a size large enough to satisfy the requested size and
	 * alignment, whichever is larger.
	 */
	size_t min_block_size = HUGEPAGE_CEILING(sz_psz2u(header_size + gap_size
	    + usize));
	pszind_t pind_next = (*pind_last + 1 < sz_psz2ind(SC_LARGE_MAXCLASS)) ?
	    *pind_last + 1 : *pind_last;
	size_t next_block_size = HUGEPAGE_CEILING(sz_pind2sz(pind_next));
	size_t block_size = (min_block_size > next_block_size) ? min_block_size
	    : next_block_size;
	base_block_t *block = (base_block_t *)base_map(tsdn, ehooks, ind,
	    block_size);
	if (block == NULL) {
		return NULL;
	}

	if (metadata_thp_madvise()) {
		void *addr = (void *)block;
		assert(((uintptr_t)addr & HUGEPAGE_MASK) == 0 &&
		    (block_size & HUGEPAGE_MASK) == 0);
		if (opt_metadata_thp == metadata_thp_always) {
			pages_huge(addr, block_size);
		} else if (opt_metadata_thp == metadata_thp_auto &&
		    base != NULL) {
			/* base != NULL indicates this is not a new base. */
			malloc_mutex_lock(tsdn, &base->mtx);
			base_auto_thp_switch(tsdn, base);
			if (base->auto_thp_switched) {
				pages_huge(addr, block_size);
			}
			malloc_mutex_unlock(tsdn, &base->mtx);
		}
	}

	*pind_last = sz_psz2ind(block_size);
	block->size = block_size;
	block->next = NULL;
	assert(block_size >= header_size);
	base_edata_init(extent_sn_next, &block->edata,
	    (void *)((byte_t *)block + header_size), block_size - header_size);
	return block;
}